

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_controller.cpp
# Opt level: O2

void __thiscall
ConfidentialTransactionController_SetAssetIssuanceTest1_Test::TestBody
          (ConfidentialTransactionController_SetAssetIssuanceTest1_Test *this)

{
  _func_int **lhs;
  bool bVar1;
  __type _Var2;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  char *pcVar3;
  uint uVar4;
  AssertionResult gtest_ar_1;
  undefined8 in_stack_fffffffffffff9b8;
  undefined8 in_stack_fffffffffffff9c0;
  AssertionResult gtest_ar;
  IssuanceParameter local_5e8;
  undefined1 local_578 [24];
  undefined1 local_560;
  undefined1 local_558 [24];
  ByteData256 contract_hash;
  Txid txid;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_508;
  IssuanceParameter param;
  ConfidentialTransactionController tx;
  ConfidentialTransactionController expect_tx;
  ConfidentialTransactionController tx_base;
  Address asset_address;
  Address token_address;
  IssuanceParameter local_a0;
  
  std::__cxx11::string::string
            ((string *)&asset_address,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000"
             ,(allocator *)&token_address);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&tx_base,(string *)&asset_address);
  std::__cxx11::string::~string((string *)&asset_address);
  std::__cxx11::string::string
            ((string *)&asset_address,
             "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000"
             ,(allocator *)&token_address);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController
            (&expect_tx,(string *)&asset_address);
  std::__cxx11::string::~string((string *)&asset_address);
  cfd::ConfidentialTransactionController::ConfidentialTransactionController(&tx,&tx_base);
  std::__cxx11::string::string
            ((string *)&asset_address,
             "c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f",
             (allocator *)&token_address);
  cfd::core::Txid::Txid(&txid,(string *)&asset_address);
  std::__cxx11::string::~string((string *)&asset_address);
  local_578._16_8_ = cfd::core::Amount::CreateByCoinAmount(100.0);
  local_560 = extraout_DL;
  local_578._0_8_ = cfd::core::Amount::CreateByCoinAmount(10.0);
  local_578[8] = extraout_DL_00;
  std::__cxx11::string::string
            ((string *)&token_address,"2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z",(allocator *)&local_5e8)
  ;
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&asset_address,(string *)&token_address,(vector *)&param);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &param);
  std::__cxx11::string::~string((string *)&token_address);
  std::__cxx11::string::string
            ((string *)&param,"2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG",(allocator *)&gtest_ar_1);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(&token_address,(string *)&param,(vector *)&local_5e8);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             &local_5e8);
  std::__cxx11::string::~string((string *)&param);
  cfd::core::ByteData256::ByteData256(&contract_hash);
  cfd::core::IssuanceParameter::IssuanceParameter(&param);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)local_558);
      cfd::core::Address::GetLockingScript();
      cfd::core::ByteData::ByteData((ByteData *)&local_508);
      cfd::ConfidentialTransactionController::SetAssetIssuance
                ((Txid *)&local_5e8,(uint)&tx,(Amount *)&txid,(Script *)0x1,
                 (ByteData *)(local_578 + 0x10),(Amount *)&gtest_ar_1,(Script *)local_558,
                 (ByteData *)local_578,SUB81(&gtest_ar,0),(ByteData256 *)&local_508,false,
                 SUB81(&contract_hash,0));
      cfd::core::IssuanceParameter::operator=(&param,&local_5e8);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_5e8);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_508);
      cfd::core::Script::~Script((Script *)&gtest_ar);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
      cfd::core::Script::~Script((Script *)&gtest_ar_1);
    }
  }
  else {
    testing::Message::Message((Message *)&local_5e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4d,
               "Expected: (param = tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, false)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5e8);
  }
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  lhs = local_5e8.entropy._vptr_BlindFactor;
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",(char *)lhs,
             (char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_));
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&local_5e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_5e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x4e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar_1,"param.entropy.GetHex().c_str()",
             "\"0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70\"",
             (char *)local_5e8.entropy._vptr_BlindFactor,
             "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");
  std::__cxx11::string::~string((string *)&local_5e8);
  if (gtest_ar_1.success_ == false) {
    testing::Message::Message((Message *)&local_5e8);
    if (gtest_ar_1.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar_1.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x51,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_1.message_);
  uVar4 = 0;
  do {
    cfd::ConfidentialTransactionController::operator=(&tx,&tx_base);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)&gtest_ar);
        cfd::core::Address::GetLockingScript();
        cfd::core::ByteData::ByteData((ByteData *)local_558);
        cfd::ConfidentialTransactionController::SetAssetIssuance
                  ((Txid *)&local_a0,(uint)&tx,(Amount *)&txid,(Script *)0x1,
                   (ByteData *)(local_578 + 0x10),(Amount *)&local_5e8,(Script *)&gtest_ar,
                   (ByteData *)local_578,SUB81(&gtest_ar_1,0),(ByteData256 *)local_558,false,
                   SUB81(&contract_hash,0));
        cfd::core::IssuanceParameter::~IssuanceParameter(&local_a0);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_558);
        cfd::core::Script::~Script((Script *)&gtest_ar_1);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar);
        cfd::core::Script::~Script((Script *)&local_5e8);
      }
    }
    else {
      testing::Message::Message((Message *)&local_5e8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
                 ,0x5d,
                 "Expected: (tx.SetAssetIssuance(txid, 1, asset_amount, asset_address.GetLockingScript(), ByteData(), token_amount, token_address.GetLockingScript(), ByteData(), is_blind, contract_hash, true)) doesn\'t throw an exception.\n  Actual: it throws."
                );
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_5e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
      testing::internal::
      scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_5e8);
    }
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    cfd::AbstractTransactionController::GetHex_abi_cxx11_();
    _Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &local_5e8,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &gtest_ar_1);
    std::__cxx11::string::~string((string *)&gtest_ar_1);
    std::__cxx11::string::~string((string *)&local_5e8);
  } while ((_Var2) && (bVar1 = uVar4 < 9, uVar4 = uVar4 + 1, bVar1));
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  cfd::AbstractTransactionController::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTRNE
            ((char *)in_stack_fffffffffffff9c0,(char *)in_stack_fffffffffffff9b8,
             (char *)gtest_ar_1.message_.ptr_,(char *)CONCAT71(gtest_ar_1._1_7_,gtest_ar_1.success_)
            );
  std::__cxx11::string::~string((string *)&gtest_ar_1);
  std::__cxx11::string::~string((string *)&local_5e8);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_5e8);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_controller.cpp"
               ,0x60,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1,(Message *)&local_5e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_5e8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::IssuanceParameter::~IssuanceParameter(&param);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&contract_hash);
  cfd::core::Address::~Address(&token_address);
  cfd::core::Address::~Address(&asset_address);
  cfd::core::Txid::~Txid(&txid);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&tx);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&expect_tx);
  cfd::ConfidentialTransactionController::~ConfidentialTransactionController(&tx_base);
  return;
}

Assistant:

TEST(ConfidentialTransactionController, SetAssetIssuanceTest1)
{
  ConfidentialTransactionController tx_base(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000000171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff020135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb5390770000000000");
  ConfidentialTransactionController expect_tx(
      "0200000001017f3da365db9401a4d3facf68d2ccb6372bb714491987e5d035d2b474721078c601000080171600149a417c11cb67e1dc522997f07e1ff89e960d5ff1fdffffff000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000100000002540be40001000000003b9aca00040135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c84010000000002f9c1ec0017a914c9cbab5b0f3430e824b1961bf8e876be43d3fee0870135e7a177b434ee0799be6dcffc945a1d892f2e0fdfc5975ba0f80d3bdbab9c8401000000000000e07400000107ec1ec7027d89071814d5ccd1f5ea4cee45e598287fc8f59acbb1d9129081dc0100000002540be400001976a914144f003aa8dd6408ba0e8ee91757cf1f1976315c88ac01aaf1579c847497d406605b4ef875a2b37164f4c5b9e5d2a23b2b2a16e132ec0501000000003b9aca00001976a914ae8cab151547d6f6e25b62b41200368dfdabe62b88ac0000000000000247304402207ab059e55e3e4337e88e1a6db00b7549110065eb5770880b1081dcdcdcf1c9a402207a3a0bc7d0d40661f54eff63c67838260a489984138d24eeee04b689f393bf2e012103753cff6c6123d25d99a3d02dc050a2c6b3ea40bcc04029c4330a4d30cb539077000000000000000000");

  // not blind
  ConfidentialTransactionController tx(tx_base);
  Txid txid("c678107274b4d235d0e587194914b72b37b6ccd268cffad3a40194db65a33d7f");
  Amount asset_amount = Amount::CreateByCoinAmount(100.0);
  Amount token_amount = Amount::CreateByCoinAmount(10.0);
  Address asset_address("2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z", cfd::core::GetElementsAddressFormatList());
  Address token_address("2dqLgUheB1R4gw7G2DKuxBeMr1jdgxECAoG", cfd::core::GetElementsAddressFormatList());
  ByteData256 contract_hash;
  bool is_blind = false;
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetIssuance(txid, 1, asset_amount,
                                   asset_address.GetLockingScript(),
                                   ByteData(), token_amount,
                                   token_address.GetLockingScript(),
                                   ByteData(), is_blind,
                                   contract_hash, false)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
  EXPECT_STREQ(
      param.entropy.GetHex().c_str(),
      "0a002ed099bd2d52f4bb04d36ebc159c838f0557461d462127845b996e61cb70");

  // txout randomize
  uint32_t retry_count = 0;
  do {
    tx = tx_base;
    EXPECT_NO_THROW(
        (tx.SetAssetIssuance(txid, 1, asset_amount,
                             asset_address.GetLockingScript(),
                             ByteData(), token_amount,
                             token_address.GetLockingScript(),
                             ByteData(), is_blind,
                             contract_hash, true)));
    ++retry_count;
  } while ((tx.GetHex() == expect_tx.GetHex()) && (retry_count < 10));
  EXPECT_STRNE(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}